

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool write_output_file(char *output,string *output_file)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  string msg;
  ofstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  filebuf local_218 [24];
  int aiStack_200 [54];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  if (output_file->_M_string_length == 0) {
    poVar3 = (ostream *)&std::cout;
LAB_0014c14c:
    if (output == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar1 = strlen(output);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,output,sVar1);
    }
    if (output_file->_M_string_length == 0) {
      bVar2 = true;
      std::ostream::flush();
      goto LAB_0014c1d6;
    }
    std::ofstream::close();
    bVar2 = true;
    if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) goto LAB_0014c1d6;
    std::operator+(&local_240,"Writing to output file: ",output_file);
    write_output_file();
  }
  else {
    poVar3 = (ostream *)&local_220;
    std::ofstream::open((char *)poVar3,(_Ios_Openmode)(output_file->_M_dataplus)._M_p);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) goto LAB_0014c14c;
    std::operator+(&local_240,"Writing to output file: ",output_file);
    write_output_file();
  }
  bVar2 = false;
LAB_0014c1d6:
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return bVar2;
}

Assistant:

bool write_output_file(const char *output, const std::string &output_file)
{
    std::ostream *o;
    std::ofstream f;

    if (output_file.empty()) {
        o = &std::cout;
    } else {
        f.open(output_file.c_str());
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
        o = &f;
    }

    (*o) << output;

    if (output_file.empty()) {
        std::cout.flush();
    } else {
        f.close();
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}